

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Reg4(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3)

{
  code *pcVar1;
  RegSlot RVar2;
  bool bVar3;
  RegSlot R1_00;
  RegSlot RVar4;
  RegSlot R3_00;
  undefined4 *puVar5;
  undefined6 in_register_00000032;
  FunctionBody *pFVar6;
  RegSlot local_50;
  RegSlot local_4c;
  RegSlot local_48;
  RegSlot local_44;
  uint local_40;
  RegSlot local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  local_34 = R3;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x7);
  local_40 = (uint)CONCAT62(in_register_00000032,op);
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x204,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_0088d291;
    *puVar5 = 0;
  }
  if (R0 != 0xffffffff) {
    pFVar6 = this->m_functionWrite;
    if (pFVar6 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar3) goto LAB_0088d291;
      *puVar5 = 0;
      pFVar6 = this->m_functionWrite;
    }
    local_3c = FunctionBody::MapRegSlot(pFVar6,R0);
    if (R1 != 0xffffffff) {
      pFVar6 = this->m_functionWrite;
      if (pFVar6 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar3) goto LAB_0088d291;
        *puVar5 = 0;
        pFVar6 = this->m_functionWrite;
      }
      R1_00 = FunctionBody::MapRegSlot(pFVar6,R1);
      RVar2 = local_34;
      if (R2 != 0xffffffff) {
        pFVar6 = this->m_functionWrite;
        if (pFVar6 == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (!bVar3) goto LAB_0088d291;
          *puVar5 = 0;
          pFVar6 = this->m_functionWrite;
        }
        RVar4 = FunctionBody::MapRegSlot(pFVar6,R2);
        if (RVar2 != 0xffffffff) {
          pFVar6 = this->m_functionWrite;
          local_38 = RVar4;
          if (pFVar6 != (FunctionBody *)0x0) {
LAB_0088d1a9:
            R3_00 = FunctionBody::MapRegSlot(pFVar6,RVar2);
            RVar4 = local_38;
            RVar2 = local_3c;
            local_34 = local_40 & 0xffff;
            bVar3 = TryWriteReg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                              (this,(OpCode)local_40,local_3c,R1_00,local_38,R3_00);
            if (!bVar3) {
              bVar3 = TryWriteReg4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                                (this,(OpCode)local_34,RVar2,R1_00,RVar4,R3_00);
              if (!bVar3) {
                local_50 = RVar2;
                local_48 = RVar4;
                local_4c = R1_00;
                local_44 = R3_00;
                Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,(OpCode)local_34,this);
                Data::Write(&this->m_byteCodeData,&local_50,0x10);
              }
            }
            return;
          }
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (bVar3) {
            *puVar5 = 0;
            pFVar6 = this->m_functionWrite;
            goto LAB_0088d1a9;
          }
          goto LAB_0088d291;
        }
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar5 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar3) {
    *puVar5 = 0;
    Throw::InternalError();
  }
LAB_0088d291:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg4(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg4);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);
        R3 = ConsumeReg(R3);

        MULTISIZE_LAYOUT_WRITE(Reg4, op, R0, R1, R2, R3);
    }